

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

int __thiscall branch_and_reduce_algorithm::cycleLowerBound(branch_and_reduce_algorithm *this)

{
  int iVar1;
  value_type vVar2;
  bool bVar3;
  bool bVar4;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar5;
  reference pvVar6;
  reference piVar7;
  size_type sVar8;
  int iVar9;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  int iVar10;
  int local_d8;
  int local_d4;
  int j_4;
  int j_3;
  int j_2;
  int p;
  int size2;
  int u_2;
  iterator __end6_1;
  iterator __begin6_1;
  value_type *__range6_1;
  iterator iStack_a0;
  int u_1;
  iterator __end6;
  iterator __begin6;
  value_type *__range6;
  int local_80;
  int j_1;
  int t;
  int s;
  int minSize;
  int u;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  int num;
  int j;
  int iStack_48;
  bool clique;
  int size;
  int v;
  int i_1;
  vector<int,_std::allocator<int>_> *S2;
  vector<int,_std::allocator<int>_> *S;
  vector<int,_std::allocator<int>_> *pos;
  int i;
  vector<int,_std::allocator<int>_> *id;
  int lb;
  branch_and_reduce_algorithm *this_local;
  
  id._4_4_ = this->crt;
  this_00 = &this->iter;
  for (pos._4_4_ = 0; pos._4_4_ < this->n; pos._4_4_ = pos._4_4_ + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)pos._4_4_);
    *pvVar5 = -1;
  }
  this_01 = &this->que;
  this_02 = &this->level;
  size = 0;
  do {
    if (this->n <= size) {
      sVar8 = std::vector<int,_std::allocator<int>_>::size(&this->level);
      if ((int)sVar8 != this->n * 2) {
        std::vector<int,_std::allocator<int>_>::swap(&this->level,&this->modTmp);
      }
      return id._4_4_;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)size);
    if ((*pvVar5 < 0) &&
       (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)size), *pvVar5 < 0
       )) {
      iStack_48 = size;
      j = 0;
      iVar9 = j;
      do {
        j = iVar9;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iStack_48);
        if (-1 < *pvVar5) {
          __assert_fail("id[v] < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x1c1,"int branch_and_reduce_algorithm::cycleLowerBound()");
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iStack_48);
        *pvVar5 = size;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->out,(long)iStack_48);
        iStack_48 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iStack_48);
        *pvVar5 = j;
        iVar9 = j + 1;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)j);
        *pvVar5 = iStack_48;
      } while (iStack_48 != size);
      bVar4 = true;
      for (__range4._4_4_ = 0; __range4._4_4_ < iVar9; __range4._4_4_ = __range4._4_4_ + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)__range4._4_4_);
        iVar1 = *pvVar5;
        __range4._0_4_ = 0;
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->adj,(long)iVar1);
        __end4 = std::vector<int,_std::allocator<int>_>::begin(pvVar6);
        _minSize = std::vector<int,_std::allocator<int>_>::end(pvVar6);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&minSize), bVar3) {
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          iVar10 = *piVar7;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar10);
          if (*pvVar5 < 0) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar10);
            iVar10 = *pvVar5;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar1);
            if (iVar10 == *pvVar5) {
              __range4._0_4_ = (int)__range4 + 1;
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
        if ((int)__range4 != j) {
          bVar4 = false;
          break;
        }
      }
      if (bVar4) {
        id._4_4_ = j + id._4_4_;
      }
      else {
        while (j = iVar9, 5 < j) {
          t = j;
          j_1 = 0;
          local_80 = j;
          for (__range6._4_4_ = 0; __range6._4_4_ < j; __range6._4_4_ = __range6._4_4_ + 1) {
            fast_set::clear(&this->used);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (this_02,(long)__range6._4_4_);
            iVar9 = *pvVar5;
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)iVar9);
            __end6 = std::vector<int,_std::allocator<int>_>::begin(pvVar6);
            iStack_a0 = std::vector<int,_std::allocator<int>_>::end(pvVar6);
            while (bVar4 = __gnu_cxx::operator!=(&__end6,&stack0xffffffffffffff60), bVar4) {
              piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&__end6);
              iVar1 = *piVar7;
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
              if (*pvVar5 < 0) {
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar1);
                iVar10 = *pvVar5;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar9);
                if (iVar10 == *pvVar5) {
                  fast_set::add(&this->used,iVar1);
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end6);
            }
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (this_02,(long)((__range6._4_4_ + 1) % j));
            iVar9 = *pvVar5;
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)iVar9);
            __end6_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar6);
            _size2 = std::vector<int,_std::allocator<int>_>::end(pvVar6);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end6_1,
                                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&size2), bVar4) {
              piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&__end6_1);
              iVar1 = *piVar7;
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
              if (*pvVar5 < 0) {
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar1);
                iVar10 = *pvVar5;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar9);
                if (iVar10 == *pvVar5) {
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iVar1);
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (this_02,(long)((*pvVar5 + 1) % j));
                  bVar4 = fast_set::get(&this->used,*pvVar5);
                  if (bVar4) {
                    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iVar1)
                    ;
                    iVar10 = ((*pvVar5 - __range6._4_4_) + j) % j;
                    if ((iVar10 < t) && (iVar10 % 2 != 0)) {
                      j_1 = (__range6._4_4_ + 1) % j;
                      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (this_01,(long)iVar1);
                      local_80 = (*pvVar5 + 1) % j;
                      t = iVar10;
                    }
                  }
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end6_1);
            }
          }
          if (t == j) break;
          j_3 = 0;
          for (j_4 = local_80; j_4 != j_1; j_4 = (j_4 + 1) % j) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)j_4);
            vVar2 = *pvVar5;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->modTmp,(long)j_3);
            *pvVar5 = vVar2;
            j_3 = j_3 + 1;
          }
          for (local_d4 = j_1; local_d4 != local_80; local_d4 = (local_d4 + 1) % j) {
            vVar2 = this->n;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)local_d4);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar5);
            *pvVar5 = vVar2;
          }
          std::vector<int,_std::allocator<int>_>::swap(this_02,&this->modTmp);
          iVar9 = j - t;
          if (iVar9 != j_3) {
            __assert_fail("size == p",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x206,"int branch_and_reduce_algorithm::cycleLowerBound()");
          }
          if (t < 2) {
            __assert_fail("minSize > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x207,"int branch_and_reduce_algorithm::cycleLowerBound()");
          }
          id._4_4_ = (t + 1) / 2 + id._4_4_;
          for (local_d8 = 0; local_d8 < iVar9; local_d8 = local_d8 + 1) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)local_d8);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)*pvVar5);
            *pvVar5 = local_d8;
          }
        }
        if (j < 2) {
          __assert_fail("size > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x20c,"int branch_and_reduce_algorithm::cycleLowerBound()");
        }
        id._4_4_ = (j + 1) / 2 + id._4_4_;
      }
    }
    size = size + 1;
  } while( true );
}

Assistant:

int branch_and_reduce_algorithm::cycleLowerBound()
{
    int lb = crt;
    std::vector<int> &id = iter;
    for (int i = 0; i < n; i++)
        id[i] = -1;
    std::vector<int> &pos = que;
    std::vector<int> &S = level;
    std::vector<int> &S2 = modTmp;
    for (int i = 0; i < n; i++)
        if (x[i] < 0 && id[i] < 0)
        {
            int v = i;
            int size = 0;
            do
            {
                assert(id[v] < 0);
                id[v] = i;
                v = out[v];
                pos[v] = size;
                S[size++] = v;
            } while (v != i);
            bool clique = true;
            for (int j = 0; j < size; j++)
            {
                v = S[j];
                int num = 0;
                for (int u : adj[v])
                    if (x[u] < 0 && id[u] == id[v])
                        num++;
                if (num != size - 1)
                {
                    clique = false;
                    break;
                }
            }
            if (clique)
            {
                lb += size - 1;
            }
            else
            {
                while (size >= 6)
                {
                    int minSize = size, s = 0, t = size;
                    for (int j = 0; j < size; j++)
                    {
                        used.clear();
                        v = S[j];
                        for (int u : adj[v])
                            if (x[u] < 0 && id[u] == id[v])
                            {
                                used.add(u);
                            }
                        v = S[(j + 1) % size];
                        for (int u : adj[v])
                            if (x[u] < 0 && id[u] == id[v])
                            {
                                if (used.get(S[(pos[u] + 1) % size]))
                                {
                                    int size2 = (pos[u] - j + size) % size;
                                    if (minSize > size2 && size2 % 2 != 0)
                                    {
                                        minSize = size2;
                                        s = (j + 1) % size;
                                        t = (pos[u] + 1) % size;
                                    }
                                }
                            }
                    }
                    if (minSize == size)
                        break;
                    int p = 0;
                    for (int j = t; j != s; j = (j + 1) % size)
                    {
                        S2[p++] = S[j];
                    }
                    for (int j = s; j != t; j = (j + 1) % size)
                    {
                        id[S[j]] = n;
                    }

                    S.swap(S2);

                    size -= minSize;
                    assert(size == p);
                    assert(minSize > 1);
                    lb += (minSize + 1) / 2;
                    for (int j = 0; j < size; j++)
                        pos[S[j]] = j;
                }
                assert(size > 1);
                lb += (size + 1) / 2;
            }
        }

    if (static_cast<int>(level.size()) != n * 2)
    {
        level.swap(modTmp);
    }
    return lb;
}